

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O1

void __thiscall
gepard::SegmentApproximator::splitCubeCurve(SegmentApproximator *this,FloatPoint *points)

{
  double dVar1;
  double dVar2;
  Float FVar3;
  Float FVar4;
  FloatPoint local_70;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  Float local_30;
  Float local_28;
  double local_20;
  double local_18;
  
  local_18 = points->x;
  local_20 = points->y;
  local_50 = points[1].x;
  local_48 = points[1].y;
  dVar1 = points[2].x;
  dVar2 = points[2].y;
  local_28 = points[3].x;
  local_30 = points[3].y;
  FloatPoint::FloatPoint(&local_70,local_18 + local_50,local_20 + local_48);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  local_38 = local_70.x;
  local_40 = local_70.y;
  FloatPoint::FloatPoint(&local_70,local_50 + dVar1,local_48 + dVar2);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  local_60 = local_70.x;
  local_58 = local_70.y;
  FloatPoint::FloatPoint(&local_70,dVar1 + local_28,dVar2 + local_30);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  FVar4 = local_70.y;
  FVar3 = local_70.x;
  FloatPoint::FloatPoint(&local_70,local_38 + local_60,local_40 + local_58);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  local_48 = local_70.x;
  local_50 = local_70.y;
  FloatPoint::FloatPoint(&local_70,local_60 + FVar3,local_58 + FVar4);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  local_58 = local_70.x;
  local_60 = local_70.y;
  FloatPoint::FloatPoint(&local_70,local_48 + local_70.x,local_50 + local_70.y);
  FloatPoint::FloatPoint(&local_70,local_70.x * 0.5,local_70.y * 0.5);
  points->x = local_18;
  points->y = local_20;
  points[1].x = local_38;
  points[1].y = local_40;
  points[2].x = local_48;
  points[2].y = local_50;
  points[3].x = local_70.x;
  points[3].y = local_70.y;
  points[4].x = local_58;
  points[4].y = local_60;
  points[5].x = FVar3;
  points[5].y = FVar4;
  points[6].x = local_28;
  points[6].y = local_30;
  return;
}

Assistant:

void SegmentApproximator::splitCubeCurve(FloatPoint points[])
{
    const FloatPoint a = points[0];
    const FloatPoint b = points[1];
    const FloatPoint c = points[2];
    const FloatPoint d = points[3];
    const FloatPoint ab = (a + b) / 2.0;
    const FloatPoint bc = (b + c) / 2.0;
    const FloatPoint cd = (c + d) / 2.0;
    const FloatPoint abbc = (ab + bc) / 2.0;
    const FloatPoint bccd = (bc + cd) / 2.0;
    const FloatPoint mid = (abbc + bccd) / 2.0;

    points[0] = a;
    points[1] = ab;
    points[2] = abbc;
    points[3] = mid;
    points[4] = bccd;
    points[5] = cd;
    points[6] = d;
}